

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedInputStream::PrintTotalBytesLimitError(CodedInputStream *this)

{
  LogMessage *pLVar1;
  LogMessage local_20;
  
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,0xbf);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,
                      (char (*) [67])
                      "A protocol message was rejected because it was too big (more than ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,this->total_bytes_limit_)
  ;
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (pLVar1,(char (*) [150])
                    " bytes).  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in third_party/protobuf/io/coded_stream.h."
            );
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_20);
  return;
}

Assistant:

void CodedInputStream::PrintTotalBytesLimitError() {
  ABSL_LOG(ERROR) << "A protocol message was rejected because it was too "
                     "big (more than "
                  << total_bytes_limit_
                  << " bytes).  To increase the limit (or to disable these "
                     "warnings), see CodedInputStream::SetTotalBytesLimit() "
                     "in third_party/protobuf/io/coded_stream.h.";
}